

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

void MRIStepCoupling_Free(MRIStepCoupling MRIC)

{
  realtype *prVar1;
  long lVar2;
  long lVar3;
  
  if (MRIC != (MRIStepCoupling)0x0) {
    free(MRIC->c);
    if (MRIC->W != (realtype ***)0x0) {
      for (lVar2 = 0; lVar2 < MRIC->nmat; lVar2 = lVar2 + 1) {
        if (MRIC->W[lVar2] != (realtype **)0x0) {
          for (lVar3 = 0; lVar3 < MRIC->stages; lVar3 = lVar3 + 1) {
            prVar1 = MRIC->W[lVar2][lVar3];
            if (prVar1 != (realtype *)0x0) {
              free(prVar1);
              MRIC->W[lVar2][lVar3] = (realtype *)0x0;
            }
          }
          free(MRIC->W[lVar2]);
          MRIC->W[lVar2] = (realtype **)0x0;
        }
      }
      free(MRIC->W);
    }
    if (MRIC->G != (realtype ***)0x0) {
      for (lVar2 = 0; lVar2 < MRIC->nmat; lVar2 = lVar2 + 1) {
        if (MRIC->G[lVar2] != (realtype **)0x0) {
          for (lVar3 = 0; lVar3 < MRIC->stages; lVar3 = lVar3 + 1) {
            prVar1 = MRIC->G[lVar2][lVar3];
            if (prVar1 != (realtype *)0x0) {
              free(prVar1);
              MRIC->G[lVar2][lVar3] = (realtype *)0x0;
            }
          }
          free(MRIC->G[lVar2]);
          MRIC->G[lVar2] = (realtype **)0x0;
        }
      }
      free(MRIC->G);
    }
    free(MRIC);
    return;
  }
  return;
}

Assistant:

void MRIStepCoupling_Free(MRIStepCoupling MRIC)
{
  int k, i;

  /* Free each field within MRIStepCoupling structure, and then
     free structure itself */
  if (MRIC) {

    if (MRIC->c)
      free(MRIC->c);

    if (MRIC->W) {
      for (k=0; k<MRIC->nmat; k++)
        if (MRIC->W[k]) {
          for (i=0; i<MRIC->stages; i++)
            if (MRIC->W[k][i]) {
              free(MRIC->W[k][i]);
              MRIC->W[k][i] = NULL;
            }
          free(MRIC->W[k]);
          MRIC->W[k] = NULL;
        }
      free(MRIC->W);
    }

    if (MRIC->G) {
      for (k=0; k<MRIC->nmat; k++)
        if (MRIC->G[k]) {
          for (i=0; i<MRIC->stages; i++)
            if (MRIC->G[k][i]) {
              free(MRIC->G[k][i]);
              MRIC->G[k][i] = NULL;
            }
          free(MRIC->G[k]);
          MRIC->G[k] = NULL;
        }
      free(MRIC->G);
    }

    free(MRIC);
  }
}